

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackTest.cpp
# Opt level: O2

void print<std::stack<double,std::deque<double,std::allocator<double>>>>
               (stack<double,_std::deque<double,_std::allocator<double>_>_> *t,char *s)

{
  ostream *poVar1;
  _Elt_pointer pdVar2;
  
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 3;
  poVar1 = std::operator<<((ostream *)&std::cout,s);
  std::operator<<(poVar1," contains:");
  while ((t->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
         _M_finish._M_cur !=
         (t->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
         _M_start._M_cur) {
    std::operator<<((ostream *)&std::cout,' ');
    pdVar2 = (t->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pdVar2 == (t->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pdVar2 = (t->c).super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    std::ostream::_M_insert<double>(pdVar2[-1]);
    std::deque<double,_std::allocator<double>_>::pop_back(&t->c);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.top();
		t.pop();
	}
	std::cout << std::endl;
}